

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.hpp
# Opt level: O0

basic_variable<std::allocator<char>_> * __thiscall
trial::dynamic::convert::
into<trial::dynamic::basic_variable<std::allocator<char>>,std::vector<short,std::allocator<short>>>
          (basic_variable<std::allocator<char>_> *__return_storage_ptr__,convert *this,
          vector<short,_std::allocator<short>_> *u)

{
  bool bVar1;
  error *this_00;
  error_code *in_RCX;
  error_code ec;
  undefined1 auStack_28 [8];
  error_code error;
  vector<short,_std::allocator<short>_> *u_local;
  basic_variable<std::allocator<char>_> *result;
  
  error._M_cat = (error_category *)this;
  std::error_code::error_code((error_code *)auStack_28);
  into<trial::dynamic::basic_variable<std::allocator<char>>,std::vector<short,std::allocator<short>>>
            (__return_storage_ptr__,(convert *)error._M_cat,
             (vector<short,_std::allocator<short>_> *)auStack_28,in_RCX);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)auStack_28);
  if (bVar1) {
    this_00 = (error *)__cxa_allocate_exception(0x20);
    ec._0_8_ = (ulong)auStack_28 & 0xffffffff;
    ec._M_cat = (error_category *)error._0_8_;
    dynamic::error::error(this_00,ec);
    __cxa_throw(this_00,&dynamic::error::typeinfo,dynamic::error::~error);
  }
  return __return_storage_ptr__;
}

Assistant:

T into(const U& u)
{
    std::error_code error;
    auto result = into<T>(u, error);
    if (error)
        throw dynamic::error(error);
    return result;
}